

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2min_distance_targets.cc
# Opt level: O2

bool __thiscall
S2MinDistanceCellUnionTarget::VisitContainingShapes
          (S2MinDistanceCellUnionTarget *this,S2ShapeIndex *query_index,ShapeVisitor *visitor)

{
  pointer pSVar1;
  pointer pSVar2;
  bool bVar3;
  pointer pSVar4;
  S2CellId cell_id;
  S2MinDistancePointTarget target;
  S2CellId local_70;
  S2Point local_68;
  S2MinDistancePointTarget local_50;
  
  pSVar1 = (this->cell_union_).cell_ids_.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  pSVar2 = (this->cell_union_).cell_ids_.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>.
           _M_impl.super__Vector_impl_data._M_start;
  do {
    pSVar4 = pSVar2;
    if (pSVar4 == pSVar1) break;
    local_70.id_ = pSVar4->id_;
    S2CellId::ToPoint(&local_68,&local_70);
    local_50.super_S2MinDistanceTarget._vptr_S2DistanceTarget =
         (_func_int **)&PTR__S2DistanceTarget_003059a8;
    local_50.point_.c_[2] = local_68.c_[2];
    local_50.point_.c_[0] = local_68.c_[0];
    local_50.point_.c_[1] = local_68.c_[1];
    bVar3 = S2MinDistancePointTarget::VisitContainingShapes(&local_50,query_index,visitor);
    pSVar2 = pSVar4 + 1;
  } while (bVar3);
  return pSVar4 == pSVar1;
}

Assistant:

bool S2MinDistanceCellUnionTarget::VisitContainingShapes(
    const S2ShapeIndex& query_index, const ShapeVisitor& visitor) {
  for (S2CellId cell_id : cell_union_) {
    S2MinDistancePointTarget target(cell_id.ToPoint());
    if (!target.VisitContainingShapes(query_index, visitor)) {
      return false;
    }
  }
  return true;
}